

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_rebels.cpp
# Opt level: O3

int AF_A_ShootGun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  AActor *ent;
  char *__assertion;
  bool bVar9;
  FName local_64;
  FName local_60;
  FSoundID local_5c;
  DAngle local_58;
  DAngle local_50;
  undefined8 local_48;
  AActor *local_40;
  DAngle local_38;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f69d3;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_005f6791:
        ent = (AActor *)0x0;
      }
      else {
        pPVar8 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar8 == (PClass *)0x0) {
          iVar5 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar8 = (PClass *)CONCAT44(extraout_var,iVar5);
          (ent->super_DThinker).super_DObject.Class = pPVar8;
        }
        bVar9 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar4 && bVar9) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar9 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar4) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f69d3;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005f6851;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005f69c3;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar8 = (PClass *)puVar2[1];
            if (pPVar8 == (PClass *)0x0) {
              pPVar8 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar8;
            }
            bVar9 = pPVar8 != (PClass *)0x0;
            if (pPVar8 != pPVar4 && bVar9) {
              do {
                pPVar8 = pPVar8->ParentClass;
                bVar9 = pPVar8 != (PClass *)0x0;
                if (pPVar8 == pPVar4) break;
              } while (pPVar8 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005f69d3;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005f69c3;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005f6851:
        pAVar3 = (ent->target).field_0.p;
        if (pAVar3 != (AActor *)0x0) {
          if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
            local_5c.ID = S_FindSound("monsters/rifle");
            S_Sound(ent,1,&local_5c,1.0,1.0);
            A_FaceTarget(ent);
            local_40 = (AActor *)(ent->Angles).Yaw.Degrees;
            local_48 = 0;
            P_AimLineAttack((AActor *)&stack0xffffffffffffffc8,(DAngle *)ent,2048.0,
                            (FTranslatedLineTarget *)&local_40,(DAngle *)0x0,(int)&local_48,
                            (AActor *)0x0,(AActor *)0x0);
            uVar6 = FRandom::GenRand32(&pr_shootgun);
            uVar7 = FRandom::GenRand32(&pr_shootgun);
            local_50.Degrees =
                 (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.0439453125 +
                 (ent->Angles).Yaw.Degrees;
            local_58.Degrees = local_38.Degrees;
            uVar6 = FRandom::GenRand32(&pr_shootgun);
            local_60.Index = 200;
            local_64.Index = 0x41;
            P_LineAttack(ent,&local_50,2048.0,&local_58,
                         (uint)(byte)(((char)uVar6 + (char)((uVar6 & 0xff) / 5) * -5) * '\x03' + 3),
                         &local_60,&local_64,0,(FTranslatedLineTarget *)0x0,(int *)0x0);
          }
          else {
            (ent->target).field_0.p = (AActor *)0x0;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005f69d3;
    }
    if (ent == (AActor *)0x0) goto LAB_005f6791;
  }
LAB_005f69c3:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005f69d3:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ShootGun)
{
	PARAM_ACTION_PROLOGUE;

	DAngle pitch;

	if (self->target == NULL)
		return 0;

	S_Sound (self, CHAN_WEAPON, "monsters/rifle", 1, ATTN_NORM);
	A_FaceTarget (self);
	pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE);
	P_LineAttack (self, self->Angles.Yaw + pr_shootgun.Random2() * (11.25 / 256),
		MISSILERANGE, pitch,
		3*(pr_shootgun() % 5 + 1), NAME_Hitscan, NAME_StrifePuff);
	return 0;
}